

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O2

void __thiscall PatchNameButton::handleClicked(PatchNameButton *this)

{
  SoundGroup *pSVar1;
  QString *pQVar2;
  QVariant *pQVar3;
  long lVar4;
  long lVar5;
  Item *pIVar6;
  long lVar7;
  QString timbreName;
  Item item;
  QVector<SoundGroup> groups;
  QArrayDataPointer<char16_t> local_70;
  QMenu menu;
  
  groups.d.d = (Data *)0x0;
  groups.d.ptr = (SoundGroup *)0x0;
  groups.d.size = 0;
  SynthRoute::getSoundGroups(this->synthRoute,&groups);
  QMenu::QMenu(&menu,(QWidget *)this);
  for (lVar4 = 0; pSVar1 = groups.d.ptr, lVar4 < groups.d.size; lVar4 = lVar4 + 1) {
    pQVar2 = (QString *)QMenu::addMenu((QString *)&menu);
    lVar5 = 0;
    for (lVar7 = 0; lVar7 < pSVar1[lVar4].constituents.d.size; lVar7 = lVar7 + 1) {
      pIVar6 = pSVar1[lVar4].constituents.d.ptr;
      QString::trimmed_helper(&timbreName);
      pIVar6 = (Item *)(&pIVar6->field_0x0 + lVar5);
      if (timbreName.d.size == 0) {
        QString::number((uint)&local_70,(uint)(*(byte *)pIVar6 >> 2));
        operator+((QString *)&item,"Memory Timbre #",(QString *)&local_70);
        QString::operator=(&timbreName,(QString *)&item);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&item);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      }
      pQVar3 = (QVariant *)QMenu::addAction(pQVar2);
      QVariant::fromValue<SoundGroup::Item>
                ((enable_if_t<std::is_copy_constructible_v<SoundGroup::Item>,_QVariant> *)&item,
                 pIVar6);
      QAction::setData(pQVar3);
      QVariant::~QVariant((QVariant *)&item);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&timbreName.d);
      lVar5 = lVar5 + 0x20;
    }
  }
  local_70.d = (Data *)CONCAT44(*(undefined4 *)(*(long *)&this->field_0x20 + 0x20),
                                *(undefined4 *)(*(long *)&this->field_0x20 + 0x14));
  timbreName.d.d = (Data *)QWidget::mapFromParent((QPoint *)this);
  item._0_8_ = QWidget::mapToGlobal((QPoint *)this);
  lVar4 = QMenu::exec((QPoint *)&menu,(QAction *)&item);
  if (lVar4 != 0) {
    QAction::data();
    qvariant_cast<SoundGroup::Item>(&item,(QVariant *)&timbreName);
    QVariant::~QVariant((QVariant *)&timbreName);
    SynthRoute::setTimbreOnPart
              (this->synthRoute,this->partNumber,(byte)item._0_1_ & 3,(uint)((byte)item._0_1_ >> 2))
    ;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&item.timbreName.d);
  }
  QMenu::~QMenu(&menu);
  QArrayDataPointer<SoundGroup>::~QArrayDataPointer(&groups.d);
  return;
}

Assistant:

void PatchNameButton::handleClicked() {
	QVector<SoundGroup> groups;
	synthRoute.getSoundGroups(groups);

	QMenu menu(this);
	QMenu *groupMenu = NULL;
	for (int groupIx = 0; groupIx < groups.size(); groupIx++) {
		const SoundGroup &group = groups.at(groupIx);
		groupMenu = menu.addMenu(group.name);
		const QVector<SoundGroup::Item> &items = group.constituents;
		for (int itemIx = 0; itemIx < items.size(); itemIx++) {
			const SoundGroup::Item &item = items.at(itemIx);
			QString timbreName = item.timbreName.trimmed();
			if (timbreName.isEmpty()) {
				timbreName = "Memory Timbre #" + QString::number(item.timbreNumber);
			}
			groupMenu->addAction(timbreName)->setData(QVariant::fromValue(item));
		}
	}
	QAction *triggeredAction = menu.exec(mapToGlobal(mapFromParent(geometry().bottomLeft())));
	if (triggeredAction != NULL) {
		SoundGroup::Item item = triggeredAction->data().value<SoundGroup::Item>();
		synthRoute.setTimbreOnPart(partNumber, item.timbreGroup, item.timbreNumber);
	}
}